

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate.c
# Opt level: O0

block_state deflate_slow(deflate_state *s,int flush)

{
  uInt uVar1;
  uInt uVar2;
  uInt uVar3;
  byte bVar4;
  ushf uVar5;
  ushort uVar6;
  uInt uVar7;
  uint uVar8;
  uInt uVar9;
  Bytef *local_70;
  Bytef *local_60;
  Bytef *local_50;
  uint local_3c;
  uch cc_1;
  uch cc;
  ush dist;
  uch len;
  uInt max_insert;
  int bflush;
  IPos hash_head;
  int flush_local;
  deflate_state *s_local;
  
  do {
    if (s->lookahead < 0x106) {
      fill_window(s);
      if ((s->lookahead < 0x106) && (flush == 0)) {
        return need_more;
      }
      if (s->lookahead == 0) {
        if (s->match_available != 0) {
          bVar4 = s->window[s->strstart - 1];
          s->d_buf[s->last_lit] = 0;
          uVar8 = s->last_lit;
          s->last_lit = uVar8 + 1;
          s->l_buf[uVar8] = bVar4;
          s->dyn_ltree[bVar4].fc.freq = s->dyn_ltree[bVar4].fc.freq + 1;
          s->match_available = 0;
        }
        if (s->block_start < 0) {
          local_70 = (Bytef *)0x0;
        }
        else {
          local_70 = s->window + (s->block_start & 0xffffffff);
        }
        _tr_flush_block(s,(charf *)local_70,(ulong)s->strstart - s->block_start,(uint)(flush == 4));
        s->block_start = (ulong)s->strstart;
        flush_pending(s->strm);
        if (s->strm->avail_out == 0) {
          if (flush != 4) {
            return need_more;
          }
          return finish_started;
        }
        if (flush != 4) {
          return block_done;
        }
        return finish_done;
      }
    }
    max_insert = 0;
    if (2 < s->lookahead) {
      s->ins_h = (s->ins_h << ((byte)s->hash_shift & 0x1f) ^ (uint)s->window[s->strstart + 2]) &
                 s->hash_mask;
      uVar6 = s->head[s->ins_h];
      s->prev[s->strstart & s->w_mask] = uVar6;
      max_insert = (uInt)uVar6;
      s->head[s->ins_h] = (Posf)s->strstart;
    }
    s->prev_length = s->match_length;
    s->prev_match = s->match_start;
    s->match_length = 2;
    if (((max_insert != 0) && (s->prev_length < s->max_lazy_match)) &&
       (s->strstart - max_insert <= s->w_size - 0x106)) {
      uVar7 = longest_match(s,max_insert);
      s->match_length = uVar7;
      if ((s->match_length < 6) &&
         ((s->strategy == 1 || ((s->match_length == 3 && (0x1000 < s->strstart - s->match_start)))))
         ) {
        s->match_length = 2;
      }
    }
    if ((s->prev_length < 3) || (s->prev_length < s->match_length)) {
      if (s->match_available == 0) {
        s->match_available = 1;
        s->strstart = s->strstart + 1;
        s->lookahead = s->lookahead - 1;
      }
      else {
        bVar4 = s->window[s->strstart - 1];
        s->d_buf[s->last_lit] = 0;
        uVar8 = s->last_lit;
        s->last_lit = uVar8 + 1;
        s->l_buf[uVar8] = bVar4;
        s->dyn_ltree[bVar4].fc.freq = s->dyn_ltree[bVar4].fc.freq + 1;
        if (s->last_lit == s->lit_bufsize - 1) {
          if (s->block_start < 0) {
            local_60 = (Bytef *)0x0;
          }
          else {
            local_60 = s->window + (s->block_start & 0xffffffff);
          }
          _tr_flush_block(s,(charf *)local_60,(ulong)s->strstart - s->block_start,0);
          s->block_start = (ulong)s->strstart;
          flush_pending(s->strm);
        }
        s->strstart = s->strstart + 1;
        s->lookahead = s->lookahead - 1;
        if (s->strm->avail_out == 0) {
          return need_more;
        }
      }
    }
    else {
      uVar7 = s->strstart;
      uVar1 = s->lookahead;
      bVar4 = (char)s->prev_length - 3;
      uVar5 = ((short)s->strstart + -1) - (short)s->prev_match;
      s->d_buf[s->last_lit] = uVar5;
      uVar8 = s->last_lit;
      s->last_lit = uVar8 + 1;
      s->l_buf[uVar8] = bVar4;
      uVar6 = uVar5 - 1;
      s->dyn_ltree[(int)(""[bVar4] + 0x101)].fc.freq =
           s->dyn_ltree[(int)(""[bVar4] + 0x101)].fc.freq + 1;
      if (uVar6 < 0x100) {
        bVar4 = ""[uVar6];
      }
      else {
        bVar4 = ""[((int)(uint)uVar6 >> 7) + 0x100];
      }
      local_3c = (uint)bVar4;
      s->dyn_dtree[(int)local_3c].fc.freq = s->dyn_dtree[(int)local_3c].fc.freq + 1;
      uVar2 = s->last_lit;
      uVar3 = s->lit_bufsize;
      s->lookahead = s->lookahead - (s->prev_length - 1);
      s->prev_length = s->prev_length - 2;
      do {
        uVar8 = s->strstart + 1;
        s->strstart = uVar8;
        if (uVar8 <= (uVar7 + uVar1) - 3) {
          s->ins_h = (s->ins_h << ((byte)s->hash_shift & 0x1f) ^ (uint)s->window[s->strstart + 2]) &
                     s->hash_mask;
          s->prev[s->strstart & s->w_mask] = s->head[s->ins_h];
          s->head[s->ins_h] = (Posf)s->strstart;
        }
        uVar9 = s->prev_length - 1;
        s->prev_length = uVar9;
      } while (uVar9 != 0);
      s->match_available = 0;
      s->match_length = 2;
      s->strstart = s->strstart + 1;
      if (uVar2 == uVar3 - 1) {
        if (s->block_start < 0) {
          local_50 = (Bytef *)0x0;
        }
        else {
          local_50 = s->window + (s->block_start & 0xffffffff);
        }
        _tr_flush_block(s,(charf *)local_50,(ulong)s->strstart - s->block_start,0);
        s->block_start = (ulong)s->strstart;
        flush_pending(s->strm);
        if (s->strm->avail_out == 0) {
          return need_more;
        }
      }
    }
  } while( true );
}

Assistant:

local block_state deflate_slow(deflate_state *s, int flush)
{
    IPos hash_head;          /* head of hash chain */
    int bflush;              /* set if current block must be flushed */

    /* Process the input block. */
    for (;;) {
        /* Make sure that we always have enough lookahead, except
         * at the end of the input file. We need MAX_MATCH bytes
         * for the next match, plus MIN_MATCH bytes to insert the
         * string following the next match.
         */
        if (s->lookahead < MIN_LOOKAHEAD) {
            fill_window(s);
            if (s->lookahead < MIN_LOOKAHEAD && flush == Z_NO_FLUSH) {
                return need_more;
            }
            if (s->lookahead == 0) break; /* flush the current block */
        }

        /* Insert the string window[strstart .. strstart+2] in the
         * dictionary, and set hash_head to the head of the hash chain:
         */
        hash_head = NIL;
        if (s->lookahead >= MIN_MATCH) {
            INSERT_STRING(s, s->strstart, hash_head);
        }

        /* Find the longest match, discarding those <= prev_length.
         */
        s->prev_length = s->match_length, s->prev_match = s->match_start;
        s->match_length = MIN_MATCH-1;

        if (hash_head != NIL && s->prev_length < s->max_lazy_match &&
            s->strstart - hash_head <= MAX_DIST(s)) {
            /* To simplify the code, we prevent matches with the string
             * of window index 0 (in particular we have to avoid a match
             * of the string with itself at the start of the input file).
             */
            s->match_length = longest_match (s, hash_head);
            /* longest_match() sets match_start */

            if (s->match_length <= 5 && (s->strategy == Z_FILTERED
#if TOO_FAR <= 32767
                || (s->match_length == MIN_MATCH &&
                    s->strstart - s->match_start > TOO_FAR)
#endif
                )) {

                /* If prev_match is also MIN_MATCH, match_start is garbage
                 * but we will ignore the current match anyway.
                 */
                s->match_length = MIN_MATCH-1;
            }
        }
        /* If there was a match at the previous step and the current
         * match is not better, output the previous match:
         */
        if (s->prev_length >= MIN_MATCH && s->match_length <= s->prev_length) {
            uInt max_insert = s->strstart + s->lookahead - MIN_MATCH;
            /* Do not insert strings in hash table beyond this. */

            check_match(s, s->strstart-1, s->prev_match, s->prev_length);

            _tr_tally_dist(s, s->strstart -1 - s->prev_match,
                           s->prev_length - MIN_MATCH, bflush);

            /* Insert in hash table all strings up to the end of the match.
             * strstart-1 and strstart are already inserted. If there is not
             * enough lookahead, the last two strings are not inserted in
             * the hash table.
             */
            s->lookahead -= s->prev_length-1;
            s->prev_length -= 2;
            do {
                if (++s->strstart <= max_insert) {
                    INSERT_STRING(s, s->strstart, hash_head);
                }
            } while (--s->prev_length != 0);
            s->match_available = 0;
            s->match_length = MIN_MATCH-1;
            s->strstart++;

            if (bflush) FLUSH_BLOCK(s, 0);

        } else if (s->match_available) {
            /* If there was no match at the previous position, output a
             * single literal. If there was a match but the current match
             * is longer, truncate the previous match to a single literal.
             */
            Tracevv((stderr,"%c", s->window[s->strstart-1]));
            _tr_tally_lit(s, s->window[s->strstart-1], bflush);
            if (bflush) {
                FLUSH_BLOCK_ONLY(s, 0);
            }
            s->strstart++;
            s->lookahead--;
            if (s->strm->avail_out == 0) return need_more;
        } else {
            /* There is no previous match to compare with, wait for
             * the next step to decide.
             */
            s->match_available = 1;
            s->strstart++;
            s->lookahead--;
        }
    }
    Assert (flush != Z_NO_FLUSH, "no flush?");
    if (s->match_available) {
        Tracevv((stderr,"%c", s->window[s->strstart-1]));
        _tr_tally_lit(s, s->window[s->strstart-1], bflush);
        s->match_available = 0;
    }
    FLUSH_BLOCK(s, flush == Z_FINISH);
    return flush == Z_FINISH ? finish_done : block_done;
}